

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunLoop.cpp
# Opt level: O2

Closure * __thiscall loop::RunLoop::quit_closure(Closure *__return_storage_ptr__,RunLoop *this)

{
  _Bind<void_(loop::RunLoop::*(loop::RunLoop_*))()> local_20;
  
  local_20._M_f = (offset_in_RunLoop_to_subr)quit;
  local_20._8_8_ = 0;
  local_20._M_bound_args.super__Tuple_impl<0UL,_loop::RunLoop_*>.
  super__Head_base<0UL,_loop::RunLoop_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_loop::RunLoop_*>)(_Tuple_impl<0UL,_loop::RunLoop_*>)this;
  std::function<void()>::function<std::_Bind<void(loop::RunLoop::*(loop::RunLoop*))()>,void>
            ((function<void()> *)__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

Closure RunLoop::quit_closure()
{
    return std::bind(&RunLoop::quit, this);
}